

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceMatrixDecomposition.cpp
# Opt level: O0

void __thiscall
OpenMD::ForceMatrixDecomposition::collectIntermediateData(ForceMatrixDecomposition *this)

{
  ForceMatrixDecomposition *this_local;
  
  return;
}

Assistant:

void ForceMatrixDecomposition::collectIntermediateData() {
#ifdef IS_MPI

    snap_              = sman_->getCurrentSnapshot();
    atomStorageLayout_ = sman_->getAtomStorageLayout();

    if (atomStorageLayout_ & DataStorage::dslDensity) {
      AtomPlanRealRow->scatter(atomRowData.density, snap_->atomData.density);

      int n = snap_->atomData.density.size();
      vector<RealType> rho_tmp(n, 0.0);
      AtomPlanRealColumn->scatter(atomColData.density, rho_tmp);
      for (int i = 0; i < n; i++)
        snap_->atomData.density[i] += rho_tmp[i];
    }

    // this isn't necessary if we don't have polarizable atoms, but
    // we'll leave it here for now.
    if (atomStorageLayout_ & DataStorage::dslElectricField) {
      AtomPlanVectorRow->scatter(atomRowData.electricField,
                                 snap_->atomData.electricField);

      int n = snap_->atomData.electricField.size();
      vector<Vector3d> field_tmp(n, V3Zero);
      AtomPlanVectorColumn->scatter(atomColData.electricField, field_tmp);
      for (int i = 0; i < n; i++)
        snap_->atomData.electricField[i] += field_tmp[i];
    }
#endif
  }